

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctaes.c
# Opt level: O0

void LoadBytes(AES_state *s,uchar *data16)

{
  long lVar1;
  AES_state *in_RSI;
  long in_FS_OFFSET;
  int r;
  int c;
  int in_stack_ffffffffffffffdc;
  int r_00;
  int iVar2;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (iVar2 = 0; iVar2 < 4; iVar2 = iVar2 + 1) {
    for (r_00 = 0; r_00 < 4; r_00 = r_00 + 1) {
      in_RSI = (AES_state *)((long)in_RSI->slice + 1);
      LoadByte(in_RSI,(uchar)((uint)iVar2 >> 0x18),r_00,in_stack_ffffffffffffffdc);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void LoadBytes(AES_state *s, const unsigned char* data16) {
    int c;
    for (c = 0; c < 4; c++) {
        int r;
        for (r = 0; r < 4; r++) {
            LoadByte(s, *(data16++), r, c);
        }
    }
}